

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-bi.c
# Opt level: O0

void eventfd_wait(int descriptor,uint64_t wanted)

{
  ssize_t sVar1;
  long in_RSI;
  int in_EDI;
  uint64_t stored;
  long local_18;
  long local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  while( true ) {
    sVar1 = read(local_4,&local_18,8);
    if (sVar1 == -1) {
      throw((char *)0x1022d0);
    }
    if (local_18 == local_10) break;
    sVar1 = write(local_4,&local_18,8);
    if (sVar1 == -1) {
      throw((char *)0x102303);
    }
  }
  return;
}

Assistant:

void eventfd_wait(int descriptor, uint64_t wanted) {
	uint64_t stored;

	while (true) {
		// A read from an eventfd returns the 8-byte integer
		// stored in the eventfd object *and* resets the value
		// to zero. That is, unless the EFD_SEMAPHORE flag was
		// passed at the start. In that case, the returned value
		// is *always* 1 and the stored value is decremented by
		// 1 (not reset to zero).
		if (read(descriptor, &stored, 8) == -1) {
			throw("Error reading from eventfd");
		}

		if (stored == wanted) {
			return;
		}

		// If this was not the value we were looking for
		// (e.g. if the server read the signal it set)
		// then write it back.
		if (write(descriptor, &stored, 8) == -1) {
			throw("Error writing back to eventfd");
		}
	}
}